

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMaker.h
# Opt level: O3

string * ApprovalTests::StringMaker::toString<char[9]>
                   (string *__return_storage_ptr__,char (*contents) [9])

{
  size_t sVar1;
  stringstream s;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  sVar1 = strlen(*contents);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,*contents,sVar1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  ::std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static std::string toString(const T& contents)
        {
            std::stringstream s;
            s << contents;
            return s.str();
        }